

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCheck.c
# Opt level: O0

int Abc_NtkComparePos(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int fComb)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  Abc_Obj_t *pObj;
  char *pcVar5;
  uint local_34;
  int i;
  Abc_Obj_t *pObj1;
  int fComb_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  iVar1 = Abc_NtkPoNum(pNtk1);
  iVar2 = Abc_NtkPoNum(pNtk2);
  if (iVar1 == iVar2) {
    for (local_34 = 0; iVar1 = Abc_NtkPoNum(pNtk1), (int)local_34 < iVar1; local_34 = local_34 + 1)
    {
      pAVar3 = Abc_NtkPo(pNtk1,local_34);
      pcVar4 = Abc_ObjName(pAVar3);
      pObj = Abc_NtkPo(pNtk2,local_34);
      pcVar5 = Abc_ObjName(pObj);
      iVar1 = strcmp(pcVar4,pcVar5);
      if (iVar1 != 0) {
        pcVar4 = Abc_ObjName(pAVar3);
        pAVar3 = Abc_NtkPo(pNtk2,local_34);
        pcVar5 = Abc_ObjName(pAVar3);
        printf("Primary output #%d is different in network 1 ( \"%s\") and in network 2 (\"%s\").\n"
               ,(ulong)local_34,pcVar4,pcVar5);
        return 0;
      }
    }
    pNtk1_local._4_4_ = 1;
  }
  else {
    printf("Networks have different number of primary outputs.\n");
    pNtk1_local._4_4_ = 0;
  }
  return pNtk1_local._4_4_;
}

Assistant:

int Abc_NtkComparePos( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int fComb )
{
    Abc_Obj_t * pObj1;
    int i;
    if ( Abc_NtkPoNum(pNtk1) != Abc_NtkPoNum(pNtk2) )
    {
        printf( "Networks have different number of primary outputs.\n" );
        return 0;
    }
    // for each PO of pNet1 find corresponding PO of pNet2 and reorder them
    Abc_NtkForEachPo( pNtk1, pObj1, i )
    {
        if ( strcmp( Abc_ObjName(pObj1), Abc_ObjName(Abc_NtkPo(pNtk2,i)) ) != 0 )
        {
            printf( "Primary output #%d is different in network 1 ( \"%s\") and in network 2 (\"%s\").\n", 
                i, Abc_ObjName(pObj1), Abc_ObjName(Abc_NtkPo(pNtk2,i)) );
            return 0;
        }
    }
    return 1;
}